

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper-a64.c
# Opt level: O0

void daif_check(CPUARMState_conflict *env,uint32_t op,uint32_t imm,uintptr_t ra)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  uintptr_t ra_local;
  uint32_t imm_local;
  uint32_t op_local;
  CPUARMState_conflict *env_local;
  
  iVar1 = arm_current_el(env);
  if (iVar1 == 0) {
    uVar4 = arm_sctlr_aarch64(env,0);
    if ((uVar4 & 0x200) == 0) {
      uVar2 = extract32(op,0,3);
      uVar3 = extract32(op,3,3);
      uVar2 = syn_aa64_sysregtrap(0,uVar2,uVar3,4,imm,0x1f,0);
      uVar3 = exception_target_el(env);
      raise_exception_ra_aarch64(env,1,uVar2,uVar3,ra);
    }
  }
  return;
}

Assistant:

static void daif_check(CPUARMState *env, uint32_t op,
                       uint32_t imm, uintptr_t ra)
{
    /* DAIF update to PSTATE. This is OK from EL0 only if UMA is set.  */
    if (arm_current_el(env) == 0 && !(arm_sctlr(env, 0) & SCTLR_UMA)) {
        raise_exception_ra(env, EXCP_UDEF,
                           syn_aa64_sysregtrap(0, extract32(op, 0, 3),
                                               extract32(op, 3, 3), 4,
                                               imm, 0x1f, 0),
                           exception_target_el(env), ra);
    }
}